

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FinalParser.cpp
# Opt level: O2

MiddleVal * __thiscall FinalParser::term(MiddleVal *__return_storage_ptr__,FinalParser *this)

{
  bool bVar1;
  MiddleVal *this_00;
  string tk;
  string local_110;
  string local_f0;
  MiddleVal local_d0;
  string local_a0;
  MiddleVal local_80;
  string local_50;
  
  factor(__return_storage_ptr__,this);
  getnow_abi_cxx11_(&local_110,this);
  do {
    bVar1 = std::operator==(&local_110,"*");
    if (!bVar1) {
      bVar1 = std::operator==(&local_110,"/");
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&local_110);
        return __return_storage_ptr__;
      }
    }
    bVar1 = std::operator==(&local_110,"*");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_a0,"*",(allocator *)&local_50);
      match(this,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      factor(&local_d0,this);
      MiddleVal::operator*=(__return_storage_ptr__,&local_d0);
      this_00 = &local_d0;
    }
    else {
      std::__cxx11::string::string((string *)&local_f0,"/",(allocator *)&local_50);
      match(this,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      factor(&local_80,this);
      MiddleVal::operator/=(__return_storage_ptr__,&local_80);
      this_00 = &local_80;
    }
    std::__cxx11::string::~string((string *)this_00);
    getnow_abi_cxx11_(&local_50,this);
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

MiddleVal FinalParser::term() {
    MiddleVal temp = factor();
    std::string tk = getnow();
    while (tk == "*" || tk == "/") {
        if (tk == "*") {
            match("*");
            temp *= factor();
        } else {
            match("/");
            temp /= factor();
        }
        tk = getnow();
    }
    return temp;
}